

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManSerializer.cpp
# Opt level: O1

DmvVecPtrMap * __thiscall
adios2::format::DataManSerializer::GetFullMetadataMap
          (DmvVecPtrMap *__return_storage_ptr__,DataManSerializer *this)

{
  size_t sVar1;
  undefined4 uVar2;
  int iVar3;
  undefined8 uVar4;
  ScopedTimer __var2406;
  __alloc_node_gen_t __alloc_node_gen;
  ScopedTimer local_28;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_false>_>_>
  local_20;
  
  if (GetFullMetadataMap()::__var406 == '\0') {
    iVar3 = __cxa_guard_acquire(&GetFullMetadataMap()::__var406);
    if (iVar3 != 0) {
      uVar4 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/dataman/DataManSerializer.cpp"
                                  ,
                                  "DmvVecPtrMap adios2::format::DataManSerializer::GetFullMetadataMap()"
                                  ,0x196);
      GetFullMetadataMap::__var406 = (void *)ps_timer_create_(uVar4);
      __cxa_guard_release(&GetFullMetadataMap()::__var406);
    }
  }
  local_28.m_timer = GetFullMetadataMap::__var406;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_DataManVarMapMutex);
  if (iVar3 == 0) {
    (__return_storage_ptr__->_M_h)._M_buckets = (__buckets_ptr)0x0;
    (__return_storage_ptr__->_M_h)._M_bucket_count = (this->m_DataManVarMap)._M_h._M_bucket_count;
    (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->_M_h)._M_element_count = (this->m_DataManVarMap)._M_h._M_element_count;
    uVar2 = *(undefined4 *)&(this->m_DataManVarMap)._M_h._M_rehash_policy.field_0x4;
    sVar1 = (this->m_DataManVarMap)._M_h._M_rehash_policy._M_next_resize;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor =
         (this->m_DataManVarMap)._M_h._M_rehash_policy._M_max_load_factor;
    *(undefined4 *)&(__return_storage_ptr__->_M_h)._M_rehash_policy.field_0x4 = uVar2;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = sVar1;
    (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    local_20._M_h = (__hashtable_alloc *)__return_storage_ptr__;
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<std::vector<adios2::format::DataManVar,std::allocator<adios2::format::DataManVar>>>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<std::vector<adios2::format::DataManVar,std::allocator<adios2::format::DataManVar>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_assign<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<std::vector<adios2::format::DataManVar,std::allocator<adios2::format::DataManVar>>>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<std::vector<adios2::format::DataManVar,std::allocator<adios2::format::DataManVar>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_long_const,std::shared_ptr<std::vector<adios2::format::DataManVar,std::allocator<adios2::format::DataManVar>>>>,false>>>>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<std::vector<adios2::format::DataManVar,std::allocator<adios2::format::DataManVar>>>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<std::vector<adios2::format::DataManVar,std::allocator<adios2::format::DataManVar>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)__return_storage_ptr__,&(this->m_DataManVarMap)._M_h,&local_20);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_DataManVarMapMutex);
    external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_28);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

DmvVecPtrMap DataManSerializer::GetFullMetadataMap()
{
    PERFSTUBS_SCOPED_TIMER_FUNC();
    std::lock_guard<std::mutex> l(m_DataManVarMapMutex);
    return m_DataManVarMap;
}